

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
insert_simplex_and_subfaces<std::initializer_list<int>>
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,
          initializer_list<int> *Nsimplex,Filtration_value *filtration)

{
  Filtration_value FVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  Filtration_value *pFVar7;
  Filtration_value *pFVar8;
  undefined8 *puVar9;
  Filtration_value FVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  Filtration_value *pFVar12;
  const_iterator __cbeg;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  Filtration_value *filt;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_bool>
  pVar13;
  
  lVar2 = *(long *)(filtration + 2);
  if (lVar2 == 0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    lVar3 = *(long *)filtration;
    if ((char)in_FS_OFFSET[-0x21] == '\0') {
      insert_simplex_and_subfaces<std::initializer_list<int>>();
    }
    lVar4 = in_FS_OFFSET[-0x24];
    if (in_FS_OFFSET[-0x23] != lVar4) {
      in_FS_OFFSET[-0x23] = lVar4;
    }
    std::vector<int,std::allocator<int>>::_M_range_insert<int_const*>
              ((vector<int,std::allocator<int>> *)(*in_FS_OFFSET + -0x120),lVar4,lVar3,
               lVar3 + lVar2 * 4);
    last._M_current = (int *)in_FS_OFFSET[-0x24];
    filt = (Filtration_value *)in_FS_OFFSET[-0x23];
    if ((Filtration_value *)last._M_current != filt) {
      uVar6 = (long)filt - (long)last._M_current >> 2;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt);
      last._M_current = (int *)in_FS_OFFSET[-0x24];
      filt = (Filtration_value *)in_FS_OFFSET[-0x23];
    }
    if ((Filtration_value *)last._M_current != filt) {
      pFVar12 = (Filtration_value *)(last._M_current + 1);
      do {
        pFVar7 = pFVar12;
        if (pFVar7 == filt) goto LAB_00155e49;
        pFVar12 = pFVar7 + 1;
      } while (pFVar7[-1] != *pFVar7);
      pFVar8 = pFVar7 + -1;
      FVar10 = pFVar7[-1];
      for (; pFVar12 != filt; pFVar12 = pFVar12 + 1) {
        FVar1 = *pFVar12;
        if (FVar10 != FVar1) {
          pFVar8[1] = FVar1;
          pFVar8 = pFVar8 + 1;
        }
        FVar10 = FVar1;
      }
      pFVar8 = pFVar8 + 1;
      if (pFVar8 != filt) {
        in_FS_OFFSET[-0x23] = (long)pFVar8;
        filt = pFVar8;
      }
    }
LAB_00155e49:
    if ((Filtration_value *)last._M_current != filt) {
      _Var11._M_current = last._M_current;
      do {
        if ((Filtration_value)*_Var11._M_current == *(Filtration_value *)&Nsimplex[3]._M_len) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = "cannot use the dummy null_vertex() as a real vertex";
          __cxa_throw(puVar9,&char_const*::typeinfo,0);
        }
        _Var11._M_current = _Var11._M_current + 1;
      } while ((Filtration_value *)_Var11._M_current != filt);
    }
    iVar5 = (int)((ulong)((long)filt - (long)last._M_current) >> 2) + -1;
    if (iVar5 < *(int *)&Nsimplex[8]._M_array) {
      iVar5 = *(int *)&Nsimplex[8]._M_array;
    }
    *(int *)&Nsimplex[8]._M_array = iVar5;
    pVar13 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (Nsimplex + 4),last,filt);
    filtration = pVar13._8_8_;
  }
  pVar13._8_8_ = filtration;
  pVar13.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
        *)this;
  return pVar13;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }